

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::PrintUTF8ErrorLog
               (char *field_name,char *operation_str,bool emit_stacktrace)

{
  LogMessage *this;
  long in_RDI;
  string quoted_field_name;
  string stacktrace;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  LogMessage *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  LogLevel level;
  LogMessage *in_stack_fffffffffffffef0;
  allocator<char> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [32];
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::allocator<char>::~allocator(&local_59);
  if (in_RDI != 0) {
    StringPrintf_abi_cxx11_((char *)local_90," \'%s\'",in_RDI);
    std::__cxx11::string::operator=(local_58,local_90);
    std::__cxx11::string::~string(local_90);
  }
  LogMessage::LogMessage
            (in_stack_fffffffffffffef0,level,(char *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffedc);
  LogMessage::operator<<
            (in_stack_fffffffffffffee0,
             (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  LogMessage::operator<<
            (in_stack_fffffffffffffee0,
             (string *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  LogMessage::operator<<
            (in_stack_fffffffffffffee0,
             (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  LogMessage::operator<<
            (in_stack_fffffffffffffee0,
             (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  LogMessage::operator<<
            (in_stack_fffffffffffffee0,
             (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  LogMessage::operator<<
            (in_stack_fffffffffffffee0,
             (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  LogMessage::operator<<
            (in_stack_fffffffffffffee0,
             (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  LogMessage::operator<<
            (in_stack_fffffffffffffee0,
             (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  this = LogMessage::operator<<
                   (in_stack_fffffffffffffee0,
                    (string *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  LogFinisher::operator=
            ((LogFinisher *)this,
             (LogMessage *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  LogMessage::~LogMessage((LogMessage *)0x4489de);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void PrintUTF8ErrorLog(const char* field_name, const char* operation_str,
                       bool emit_stacktrace) {
  std::string stacktrace;
  std::string quoted_field_name = "";
  if (field_name != nullptr) {
    quoted_field_name = StringPrintf(" '%s'", field_name);
  }
  GOOGLE_LOG(ERROR) << "String field" << quoted_field_name << " contains invalid "
             << "UTF-8 data when " << operation_str << " a protocol "
             << "buffer. Use the 'bytes' type if you intend to send raw "
             << "bytes. " << stacktrace;
}